

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void safe_fprintf(FILE *f,char *fmt,...)

{
  char cVar1;
  char in_AL;
  int iVar2;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_328 [16];
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2e8;
  undefined8 local_2d8;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 local_298;
  undefined8 local_288;
  char local_269;
  wchar_t local_268;
  uint uStack_264;
  char try_wc;
  wchar_t wc;
  uint i;
  char *p;
  va_list ap;
  int local_234;
  wchar_t local_230;
  wchar_t n;
  wchar_t length;
  wchar_t fmtbuff_length;
  char *fmtbuff;
  char *fmtbuff_heap;
  char outbuff [256];
  char fmtbuff_stack [256];
  char *fmt_local;
  FILE *f_local;
  
  if (in_AL != '\0') {
    local_2f8 = in_XMM0_Qa;
    local_2e8 = in_XMM1_Qa;
    local_2d8 = in_XMM2_Qa;
    local_2c8 = in_XMM3_Qa;
    local_2b8 = in_XMM4_Qa;
    local_2a8 = in_XMM5_Qa;
    local_298 = in_XMM6_Qa;
    local_288 = in_XMM7_Qa;
  }
  fmtbuff = (char *)0x0;
  n = L'Ā';
  ap[0].overflow_arg_area = local_328;
  ap[0]._0_8_ = &stack0x00000008;
  p._4_4_ = 0x30;
  p._0_4_ = 0x10;
  local_318 = in_RDX;
  local_310 = in_RCX;
  local_308 = in_R8;
  local_300 = in_R9;
  local_230 = vsnprintf(outbuff + 0xf8,0x100,fmt,&p);
  _length = outbuff + 0xf8;
  do {
    if (L'\xffffffff' < local_230 && local_230 < n) {
LAB_0010fafe:
      iVar2 = mbtowc((wchar_t *)0x0,(char *)0x0,1);
      if (iVar2 == -1) {
        free(fmtbuff);
      }
      else {
        _wc = _length;
        uStack_264 = 0;
        local_269 = '\x01';
        while (*_wc != '\0') {
          if ((local_269 == '\0') ||
             (local_234 = mbtowc(&local_268,_wc,(long)local_230), local_234 == -1)) {
            cVar1 = *_wc;
            _wc = _wc + 1;
            sVar3 = bsdtar_expand_char((char *)&fmtbuff_heap,0x100,(ulong)uStack_264,cVar1);
            uStack_264 = (int)sVar3 + uStack_264;
            local_269 = '\0';
          }
          else {
            local_230 = local_230 - local_234;
            iVar2 = iswprint(local_268);
            if ((iVar2 == 0) || (local_268 == L'\\')) {
              while (0 < local_234) {
                cVar1 = *_wc;
                _wc = _wc + 1;
                sVar3 = bsdtar_expand_char((char *)&fmtbuff_heap,0x100,(ulong)uStack_264,cVar1);
                uStack_264 = (int)sVar3 + uStack_264;
                local_234 = local_234 + -1;
              }
            }
            else {
              while (0 < local_234) {
                outbuff[(ulong)uStack_264 - 8] = *_wc;
                uStack_264 = uStack_264 + 1;
                _wc = _wc + 1;
                local_234 = local_234 + -1;
              }
            }
          }
          if (0x80 < uStack_264) {
            outbuff[(ulong)uStack_264 - 8] = '\0';
            fprintf((FILE *)f,"%s",&fmtbuff_heap);
            uStack_264 = 0;
          }
        }
        outbuff[(ulong)uStack_264 - 8] = '\0';
        fprintf((FILE *)f,"%s",&fmtbuff_heap);
        free(fmtbuff);
      }
      return;
    }
    if (local_230 < n) {
      if (n < L'\x2000') {
        n = n << 1;
      }
      else {
        if (L'\x000f423f' < n) {
          local_230 = n;
          fmtbuff[n + L'\xffffffff'] = '\0';
          goto LAB_0010fafe;
        }
        n = n / 4 + n;
      }
    }
    else {
      n = local_230 + L'\x01';
    }
    free(fmtbuff);
    fmtbuff = (char *)malloc((long)n);
    if (fmtbuff == (char *)0x0) {
      _length = outbuff + 0xf8;
      local_230 = L'ÿ';
      goto LAB_0010fafe;
    }
    ap[0].overflow_arg_area = local_328;
    ap[0]._0_8_ = &stack0x00000008;
    p._4_4_ = 0x30;
    p._0_4_ = 0x10;
    local_230 = vsnprintf(fmtbuff,(long)n,fmt,&p);
    _length = fmtbuff;
  } while( true );
}

Assistant:

void
safe_fprintf(FILE *f, const char *fmt, ...)
{
	char fmtbuff_stack[256]; /* Place to format the printf() string. */
	char outbuff[256]; /* Buffer for outgoing characters. */
	char *fmtbuff_heap; /* If fmtbuff_stack is too small, we use malloc */
	char *fmtbuff;  /* Pointer to fmtbuff_stack or fmtbuff_heap. */
	int fmtbuff_length;
	int length, n;
	va_list ap;
	const char *p;
	unsigned i;
	wchar_t wc;
	char try_wc;

	/* Use a stack-allocated buffer if we can, for speed and safety. */
	fmtbuff_heap = NULL;
	fmtbuff_length = sizeof(fmtbuff_stack);
	fmtbuff = fmtbuff_stack;

	/* Try formatting into the stack buffer. */
	va_start(ap, fmt);
	length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
	va_end(ap);

	/* If the result was too large, allocate a buffer on the heap. */
	while (length < 0 || length >= fmtbuff_length) {
		if (length >= fmtbuff_length)
			fmtbuff_length = length+1;
		else if (fmtbuff_length < 8192)
			fmtbuff_length *= 2;
		else if (fmtbuff_length < 1000000)
			fmtbuff_length += fmtbuff_length / 4;
		else {
			length = fmtbuff_length;
			fmtbuff_heap[length-1] = '\0';
			break;
		}
		free(fmtbuff_heap);
		fmtbuff_heap = malloc(fmtbuff_length);

		/* Reformat the result into the heap buffer if we can. */
		if (fmtbuff_heap != NULL) {
			fmtbuff = fmtbuff_heap;
			va_start(ap, fmt);
			length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
			va_end(ap);
		} else {
			/* Leave fmtbuff pointing to the truncated
			 * string in fmtbuff_stack. */
			fmtbuff = fmtbuff_stack;
			length = sizeof(fmtbuff_stack) - 1;
			break;
		}
	}

	/* Note: mbrtowc() has a cleaner API, but mbtowc() seems a bit
	 * more portable, so we use that here instead. */
	if (mbtowc(NULL, NULL, 1) == -1) { /* Reset the shift state. */
		/* mbtowc() should never fail in practice, but
		 * handle the theoretical error anyway. */
		free(fmtbuff_heap);
		return;
	}

	/* Write data, expanding unprintable characters. */
	p = fmtbuff;
	i = 0;
	try_wc = 1;
	while (*p != '\0') {

		/* Convert to wide char, test if the wide
		 * char is printable in the current locale. */
		if (try_wc && (n = mbtowc(&wc, p, length)) != -1) {
			length -= n;
			if (iswprint(wc) && wc != L'\\') {
				/* Printable, copy the bytes through. */
				while (n-- > 0)
					outbuff[i++] = *p++;
			} else {
				/* Not printable, format the bytes. */
				while (n-- > 0)
					i += (unsigned)bsdtar_expand_char(
					    outbuff, sizeof(outbuff), i, *p++);
			}
		} else {
			/* After any conversion failure, don't bother
			 * trying to convert the rest. */
			i += (unsigned)bsdtar_expand_char(outbuff, sizeof(outbuff), i, *p++);
			try_wc = 0;
		}

		/* If our output buffer is full, dump it and keep going. */
		if (i > (sizeof(outbuff) - 128)) {
			outbuff[i] = '\0';
			fprintf(f, "%s", outbuff);
			i = 0;
		}
	}
	outbuff[i] = '\0';
	fprintf(f, "%s", outbuff);

	/* If we allocated a heap-based formatting buffer, free it now. */
	free(fmtbuff_heap);
}